

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_read_header_obj_info(p_ply ply)

{
  int iVar1;
  char *in_RDI;
  p_ply in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = strcmp(in_RDI + *(long *)(in_RDI + 0x2058) + 0x4c,"obj_info");
  if (iVar1 == 0) {
    iVar1 = ply_read_line(in_stack_ffffffffffffffe8);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = ply_add_obj_info((p_ply)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                               in_RDI);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        iVar1 = ply_read_word(in_stack_ffffffffffffffe8);
        if (iVar1 == 0) {
          iVar1 = 0;
        }
        else {
          iVar1 = 1;
        }
      }
    }
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int ply_read_header_obj_info(p_ply ply) {
    assert(ply && (ply->fp || ply->gzfp) && ply->io_mode == PLY_READ);
    if (strcmp(BWORD(ply), "obj_info")) return 0;
    if (!ply_read_line(ply)) return 0;
    if (!ply_add_obj_info(ply, BLINE(ply))) return 0;
    if (!ply_read_word(ply)) return 0;
    return 1;
}